

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::MessagePattern::autoQuoteApostropheDeep
          (UnicodeString *__return_storage_ptr__,MessagePattern *this)

{
  UMessagePatternPartType UVar1;
  Part *this_00;
  Part *part;
  int32_t i;
  int32_t count;
  MessagePattern *this_local;
  UnicodeString *modified;
  
  if (this->needsAutoQuoting == '\0') {
    UnicodeString::UnicodeString(__return_storage_ptr__,&this->msg);
  }
  else {
    UnicodeString::UnicodeString(__return_storage_ptr__,&this->msg);
    part._0_4_ = countParts(this);
    while (0 < (int32_t)part) {
      part._0_4_ = (int32_t)part + -1;
      this_00 = getPart(this,(int32_t)part);
      UVar1 = Part::getType(this_00);
      if (UVar1 == UMSGPAT_PART_TYPE_INSERT_CHAR) {
        UnicodeString::insert(__return_storage_ptr__,this_00->index,this_00->value);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
MessagePattern::autoQuoteApostropheDeep() const {
    if(!needsAutoQuoting) {
        return msg;
    }
    UnicodeString modified(msg);
    // Iterate backward so that the insertion indexes do not change.
    int32_t count=countParts();
    for(int32_t i=count; i>0;) {
        const Part &part=getPart(--i);
        if(part.getType()==UMSGPAT_PART_TYPE_INSERT_CHAR) {
           modified.insert(part.index, (UChar)part.value);
        }
    }
    return modified;
}